

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O3

ArrayWithPreallocation<unsigned_char,_8UL> * __thiscall
soul::ArrayWithPreallocation<unsigned_char,_8UL>::operator=
          (ArrayWithPreallocation<unsigned_char,_8UL> *this,
          ArrayWithPreallocation<unsigned_char,_8UL> *other)

{
  size_t i;
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = other->numActive;
  if (this->numActive < uVar1) {
    reserve(this,uVar1);
    if (this->numActive == 0) {
      uVar1 = 0;
    }
    else {
      uVar2 = 0;
      do {
        this->items[uVar2] = other->items[uVar2];
        uVar2 = uVar2 + 1;
        uVar1 = this->numActive;
      } while (uVar2 < uVar1);
    }
    for (; uVar1 < other->numActive; uVar1 = uVar1 + 1) {
      this->items[uVar1] = other->items[uVar1];
    }
    this->numActive = other->numActive;
  }
  else {
    shrink(this,uVar1);
    if (this->numActive != 0) {
      uVar1 = 0;
      do {
        this->items[uVar1] = other->items[uVar1];
        uVar1 = uVar1 + 1;
      } while (uVar1 < this->numActive);
    }
  }
  return this;
}

Assistant:

ArrayWithPreallocation& operator= (const ArrayWithPreallocation& other)
    {
        if (other.size() > numActive)
        {
            reserve (other.size());

            for (size_t i = 0; i < numActive; ++i)
                items[i] = other.items[i];

            for (size_t i = numActive; i < other.size(); ++i)
                new (items + i) Item (other.items[i]);

            numActive = other.size();
        }
        else
        {
            shrink (other.size());

            for (size_t i = 0; i < numActive; ++i)
                items[i] = other.items[i];
        }

        return *this;
    }